

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_msg_devid.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint16_t uVar1;
  int iVar2;
  char *pcVar3;
  char *__format;
  in_addr addr;
  in_addr local_c;
  
  if (argc < 2) {
    pcVar3 = *argv;
    __format = "usage: %s [NetTLP host addr]\n";
  }
  else {
    iVar2 = inet_pton(2,argv[1],&local_c);
    if (0 < iVar2) {
      uVar1 = nettlp_msg_get_dev_id(local_c);
      printf("dev id is 0x%x\n",(ulong)uVar1);
      return 0;
    }
    pcVar3 = argv[1];
    __format = "invalid addr %s\n";
  }
  printf(__format,pcVar3);
  return -1;
}

Assistant:

int main(int argc, char **argv)
{
	struct in_addr addr;
	uint16_t devid;

	if (argc < 2) {
		printf("usage: %s [NetTLP host addr]\n", argv[0]);
		return -1;
	}

	if (inet_pton(AF_INET, argv[1], &addr) < 1) {
		printf("invalid addr %s\n", argv[1]);
		return -1;
	}

	devid = nettlp_msg_get_dev_id(addr);
	printf("dev id is 0x%x\n", devid);

	return 0;
}